

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-buf.c
# Opt level: O1

int run_test_buf_large(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  uv_loop_t *puVar3;
  void *pvVar4;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_loop_t *unaff_RBX;
  uv_stream_t *puVar5;
  code *__size;
  uv_handle_t **ppuVar6;
  uv_timer_t *puVar7;
  uv_handle_t *handle;
  uv_buf_t uVar8;
  code *pcStack_b8;
  uv_loop_t *puStack_b0;
  undefined8 uStack_a8;
  uv_stream_t *puStack_a0;
  undefined1 auStack_68 [16];
  undefined8 uStack_58;
  uv_buf_t uStack_50;
  uv_loop_t *puStack_40;
  uv_handle_t *puStack_30;
  uv_handle_t *puStack_28;
  sockaddr_in sStack_20;
  
  uVar8 = uv_buf_init((char *)0x0,0xffffffffffffffff);
  if (uVar8.len == 0xffffffffffffffff) {
    return 0;
  }
  run_test_buf_large_cold_1();
  iVar2 = (int)&puStack_30;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_20);
  puStack_28 = (uv_handle_t *)(long)iVar1;
  puStack_30 = (uv_handle_t *)0x0;
  if (puStack_28 == (uv_handle_t *)0x0) {
    puVar3 = uv_default_loop();
    iVar1 = uv_tcp_init(puVar3,&client);
    if (iVar1 != 0) goto LAB_0017f2f1;
    puts("Connecting...");
    nested = nested + 1;
    iVar1 = uv_tcp_connect(&connect_req,&client,(sockaddr *)&sStack_20,connect_cb);
    if (iVar1 != 0) goto LAB_0017f2f6;
    nested = nested + -1;
    puVar3 = uv_default_loop();
    uv_run(puVar3,UV_RUN_DEFAULT);
    puStack_28 = (uv_handle_t *)(long)nested;
    puStack_30 = (uv_handle_t *)0x0;
    if (puStack_28 != (uv_handle_t *)0x0) goto LAB_0017f2fb;
    puStack_28 = (uv_handle_t *)(ulong)(connect_cb_called == 1);
    puStack_30 = (uv_handle_t *)0x0;
    if (puStack_28 == (uv_handle_t *)0x0) goto LAB_0017f308;
    puStack_28 = (uv_handle_t *)(ulong)(write_cb_called == 1);
    puStack_30 = (uv_handle_t *)0x0;
    if (puStack_28 == (uv_handle_t *)0x0) goto LAB_0017f315;
    puStack_28 = (uv_handle_t *)(ulong)(timer_cb_called == 1);
    puStack_30 = (uv_handle_t *)0x0;
    if (puStack_28 == (uv_handle_t *)0x0) goto LAB_0017f322;
    puStack_28 = (uv_handle_t *)(long)bytes_received;
    puStack_30 = (uv_handle_t *)0x2e;
    if (puStack_28 != (uv_handle_t *)0x2e) goto LAB_0017f32f;
    puStack_28 = (uv_handle_t *)(ulong)(shutdown_cb_called == 1);
    puStack_30 = (uv_handle_t *)0x0;
    if (puStack_28 == (uv_handle_t *)0x0) goto LAB_0017f33c;
    puStack_28 = (uv_handle_t *)(ulong)(close_cb_called == 2);
    puStack_30 = (uv_handle_t *)0x0;
    if (puStack_28 == (uv_handle_t *)0x0) goto LAB_0017f349;
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_28 = (uv_handle_t *)0x0;
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    puStack_30 = (uv_handle_t *)(long)iVar1;
    if (puStack_28 == puStack_30) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_callback_stack_cold_1();
LAB_0017f2f1:
    run_test_callback_stack_cold_2();
LAB_0017f2f6:
    run_test_callback_stack_cold_3();
LAB_0017f2fb:
    run_test_callback_stack_cold_4();
LAB_0017f308:
    run_test_callback_stack_cold_11();
LAB_0017f315:
    run_test_callback_stack_cold_10();
LAB_0017f322:
    run_test_callback_stack_cold_9();
LAB_0017f32f:
    run_test_callback_stack_cold_5();
LAB_0017f33c:
    run_test_callback_stack_cold_8();
LAB_0017f349:
    run_test_callback_stack_cold_7();
  }
  ppuVar6 = &puStack_28;
  run_test_callback_stack_cold_6();
  auStack_68._8_8_ = (uv_loop_t *)0x17f37a;
  iVar1 = iVar2;
  puStack_40 = unaff_RBX;
  puts("Connected. Write some data to echo server...");
  uStack_50.base = (char *)(long)iVar2;
  uStack_58._0_4_ = UV_UNKNOWN_HANDLE;
  uStack_58._4_4_ = 0;
  if ((uv_close_cb)uStack_50.base == (uv_close_cb)0x0) {
    if (nested != 0) goto LAB_0017f3ff;
    nested = 1;
    uStack_50.base = "Failure is for the weak. Everyone dies alone.";
    uStack_50.len = 0x2e;
    puVar5 = (uv_stream_t *)ppuVar6[10];
    auStack_68._8_8_ = (uv_loop_t *)0x17f3db;
    iVar2 = uv_write(&write_req,puVar5,(uv_buf_t *)(auStack_68 + 0x18),1,write_cb);
    iVar1 = (int)puVar5;
    if (iVar2 == 0) {
      nested = nested + -1;
      connect_cb_called = connect_cb_called + 1;
      return 0;
    }
  }
  else {
    auStack_68._8_8_ = (uv_loop_t *)0x17f3ff;
    iVar1 = (int)auStack_68 + 0x10;
    connect_cb_cold_1();
LAB_0017f3ff:
    auStack_68._8_8_ = (uv_loop_t *)0x17f404;
    connect_cb_cold_2();
  }
  auStack_68._8_8_ = write_cb;
  connect_cb_cold_3();
  auStack_68._8_8_ = SEXT48(iVar1);
  auStack_68._0_8_ = (void *)0x0;
  if ((uv_loop_t *)auStack_68._8_8_ == (uv_loop_t *)0x0) {
    if (nested != 0) goto LAB_0017f4d3;
    puts("Data written. 500ms timeout...");
    nested = nested + 1;
    puVar3 = uv_default_loop();
    iVar1 = uv_timer_init(puVar3,&timer);
    auStack_68._8_8_ = SEXT48(iVar1);
    auStack_68._0_8_ = (void *)0x0;
    if ((uv_loop_t *)auStack_68._8_8_ != (uv_loop_t *)0x0) goto LAB_0017f4d8;
    iVar1 = uv_timer_start(&timer,timer_cb,500,0);
    auStack_68._8_8_ = SEXT48(iVar1);
    auStack_68._0_8_ = (void *)0x0;
    if ((uv_loop_t *)auStack_68._8_8_ == (uv_loop_t *)0x0) {
      nested = nested + -1;
      write_cb_called = write_cb_called + 1;
      return iVar1;
    }
  }
  else {
    write_cb_cold_1();
LAB_0017f4d3:
    write_cb_cold_2();
LAB_0017f4d8:
    write_cb_cold_3();
  }
  puVar7 = (uv_timer_t *)(auStack_68 + 8);
  __size = (code *)auStack_68;
  write_cb_cold_4();
  if (puVar7 == &timer) {
    if (nested != 0) goto LAB_0017f561;
    puts("Timeout complete. Now read data...");
    nested = nested + 1;
    __size = alloc_cb;
    iVar1 = uv_read_start((uv_stream_t *)&client,alloc_cb,read_cb);
    if (iVar1 == 0) {
      nested = nested + -1;
      timer_cb_called = timer_cb_called + 1;
      uv_close((uv_handle_t *)&timer,close_cb);
      return extraout_EAX;
    }
  }
  else {
    timer_cb_cold_1();
LAB_0017f561:
    timer_cb_cold_2();
  }
  timer_cb_cold_3();
  extraout_RDX[1] = __size;
  puVar5 = (uv_stream_t *)__size;
  pvVar4 = malloc((size_t)__size);
  *extraout_RDX = pvVar4;
  if (pvVar4 != (void *)0x0) {
    return (int)pvVar4;
  }
  alloc_cb_cold_1();
  iVar1 = (int)&uStack_a8;
  if (nested == 0) {
    puStack_b0 = (uv_loop_t *)0x17f5b7;
    printf("Read. nread == %d\n");
    puStack_b0 = (uv_loop_t *)0x17f5bf;
    free((void *)*extraout_RDX_00);
    if ((uv_stream_t *)__size == (uv_stream_t *)0x0) {
      return extraout_EAX_00;
    }
    if (-1 < (long)__size) {
      bytes_received = bytes_received + (int)__size;
      if (bytes_received != 0x2e) {
        return bytes_received;
      }
      nested = nested + 1;
      puStack_b0 = (uv_loop_t *)0x17f5ec;
      puts("Shutdown");
      puStack_b0 = (uv_loop_t *)0x17f602;
      iVar2 = uv_shutdown(&shutdown_req,puVar5,shutdown_cb);
      if (iVar2 == 0) goto LAB_0017f638;
      puStack_b0 = (uv_loop_t *)0x17f60b;
      read_cb_cold_2();
    }
    uStack_a8._0_4_ = 0xfffff001;
    uStack_a8._4_4_ = 0xffffffff;
    puStack_a0 = (uv_stream_t *)__size;
    if ((uv_stream_t *)__size == (uv_stream_t *)0xfffffffffffff001) {
      nested = nested + 1;
      puStack_b0 = (uv_loop_t *)0x17f638;
      uv_close((uv_handle_t *)puVar5,close_cb);
      iVar2 = extraout_EAX_01;
LAB_0017f638:
      nested = nested + -1;
      return iVar2;
    }
  }
  else {
    puStack_b0 = (uv_loop_t *)0x17f64d;
    read_cb_cold_1();
  }
  handle = (uv_handle_t *)&puStack_a0;
  puStack_b0 = (uv_loop_t *)close_cb;
  read_cb_cold_3();
  if (nested == 0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_02;
  }
  pcStack_b8 = shutdown_cb;
  close_cb_cold_1();
  pcStack_b8 = (code *)(long)iVar1;
  if (pcStack_b8 == (code *)0x0) {
    if (nested == 0) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return iVar1;
    }
  }
  else {
    handle = (uv_handle_t *)&pcStack_b8;
    shutdown_cb_cold_1();
  }
  shutdown_cb_cold_2();
  iVar1 = uv_is_closing(handle);
  if (iVar1 == 0) {
    uv_close(handle,(uv_close_cb)0x0);
    return extraout_EAX_03;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(buf_large) {
  uv_buf_t buf;

  buf = uv_buf_init(NULL, SIZE_MAX);
#ifdef _WIN32
  WSABUF* wbuf;

  wbuf = (WSABUF*) &buf;
  ASSERT(wbuf->len == buf.len);
#else
  struct iovec* iobuf;

  iobuf = (struct iovec*) &buf;
  ASSERT(iobuf->iov_len == buf.len);
  ASSERT(buf.len == SIZE_MAX);

  /* Verify that uv_buf_t is ABI-compatible with struct iovec. */
  ASSERT(sizeof(uv_buf_t) == sizeof(struct iovec));
  ASSERT(sizeof(((uv_buf_t*) 0)->base) ==
         sizeof(((struct iovec*) 0)->iov_base));
  ASSERT(sizeof(((uv_buf_t*) 0)->len) == sizeof(((struct iovec*) 0)->iov_len));
  ASSERT(offsetof(uv_buf_t, base) == offsetof(struct iovec, iov_base));
  ASSERT(offsetof(uv_buf_t, len) == offsetof(struct iovec, iov_len));
#endif

  return 0;
}